

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyOper.c
# Opt level: O0

Ivy_Obj_t * Ivy_Oper(Ivy_Man_t *p,Ivy_Obj_t *p0,Ivy_Obj_t *p1,Ivy_Type_t Type)

{
  Ivy_Type_t Type_local;
  Ivy_Obj_t *p1_local;
  Ivy_Obj_t *p0_local;
  Ivy_Man_t *p_local;
  
  if (Type == IVY_AND) {
    p_local = (Ivy_Man_t *)Ivy_And(p,p0,p1);
  }
  else {
    if (Type != IVY_EXOR) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyOper.c"
                    ,0x45,"Ivy_Obj_t *Ivy_Oper(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Type_t)");
    }
    p_local = (Ivy_Man_t *)Ivy_Exor(p,p0,p1);
  }
  return (Ivy_Obj_t *)p_local;
}

Assistant:

Ivy_Obj_t * Ivy_Oper( Ivy_Man_t * p, Ivy_Obj_t * p0, Ivy_Obj_t * p1, Ivy_Type_t Type )
{
    if ( Type == IVY_AND )
        return Ivy_And( p, p0, p1 );
    if ( Type == IVY_EXOR )
        return Ivy_Exor( p, p0, p1 );
    assert( 0 );
    return NULL;
}